

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
           *this)

{
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar1;
  int index;
  int iVar2;
  double ub;
  double dVar3;
  double lb;
  double dVar4;
  VarHandler bh;
  VarHandler local_38;
  
  iVar2 = **(int **)(this + 8);
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  lb = 0.0;
  dVar4 = 0.0;
  local_38.
  super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>::ItemType)0>
  .reader_ = (ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>::ItemType)0>
              )(ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>::ItemType)0>
                )this;
  do {
    if (iVar2 == index) {
      return;
    }
    this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
    pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
    (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
    ub = INFINITY;
    dVar3 = -INFINITY;
    switch(*pcVar1) {
    case '0':
      dVar3 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      ub = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                     (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
      break;
    case '1':
      ub = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      dVar3 = -INFINITY;
      break;
    case '2':
      dVar3 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      ub = INFINITY;
      break;
    case '3':
      break;
    case '4':
      ub = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      dVar3 = ub;
      break;
    case '5':
      pcVar1 = "(input):12:1: COMPL bound type is invalid for variables";
      goto LAB_0019b5a8;
    default:
      pcVar1 = "(input):12:1: expected bound";
LAB_0019b5a8:
      BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,(CStringRef)(pcVar1 + 0xe));
      ub = dVar4;
      dVar3 = lb;
    }
    lb = dVar3;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
    ::VarHandler::SetBounds(&local_38,index,lb,ub);
    index = index + 1;
    dVar4 = ub;
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}